

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  Node *pNVar1;
  ctmbstr s1;
  ctmbstr s2;
  bool bVar2;
  byte bVar3;
  Bool BVar4;
  int iVar5;
  uint uVar6;
  AttVal *av;
  AttVal *attr;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      BVar4 = prvTidyIsAnchorElement(doc,node);
      if (BVar4 != no) {
        av = prvTidyAttrGetById(node,TidyAttr_NAME);
        attr = prvTidyAttrGetById(node,TidyAttr_ID);
        if (attr != (AttVal *)0x0 && av != (AttVal *)0x0) {
          s1 = av->value;
          s2 = attr->value;
          if ((s2 != (ctmbstr)0x0) == (s1 != (ctmbstr)0x0)) {
            if (s1 != (ctmbstr)0x0 && s2 != (ctmbstr)0x0) {
              iVar5 = prvTidytmbstrcmp(s1,s2);
              if (iVar5 != 0) goto LAB_0014fc30;
            }
          }
          else {
LAB_0014fc30:
            prvTidyReportAttrError(doc,node,av,0x242);
          }
          goto LAB_0014fcec;
        }
        if (wantId == no || av == (AttVal *)0x0) {
          if (wantName == no || attr == (AttVal *)0x0) {
LAB_0014fcec:
            bVar2 = false;
          }
          else {
            uVar6 = prvTidyNodeAttributeVersions(node,TidyAttr_NAME);
            if ((doc->lexer->versionEmitted & uVar6) == 0) goto LAB_0014fcec;
            prvTidyRepairAttrValue(doc,node,"name",attr->value);
            bVar2 = true;
          }
          if (attr != (AttVal *)0x0 && wantId == no) {
            if ((wantName != no) && (av == (AttVal *)0x0 && !bVar2)) goto LAB_0014fda4;
            if (wantName == no) {
              prvTidyRemoveAnchorByNode(doc,attr->value,node);
            }
            prvTidyRemoveAttribute(doc,node,attr);
            bVar2 = false;
            goto LAB_0014fd5a;
          }
          bVar3 = 0;
          bVar2 = wantId != no;
        }
        else {
          uVar6 = prvTidyNodeAttributeVersions(node,TidyAttr_ID);
          bVar2 = true;
          if ((doc->lexer->versionEmitted & uVar6) != 0) {
            BVar4 = prvTidyIsValidHTMLID(av->value);
            if (BVar4 != no) {
              prvTidyRepairAttrValue(doc,node,anon_var_dwarf_1a183 + 0x2b,av->value);
              bVar2 = true;
              bVar3 = 1;
              goto LAB_0014fd5c;
            }
            prvTidyReportAttrError(doc,node,av,0x24d);
          }
LAB_0014fd5a:
          bVar3 = 0;
        }
LAB_0014fd5c:
        if ((av != (AttVal *)0x0 && wantName == no) &&
           (!(bool)(attr == (AttVal *)0x0 & ((bVar3 | bVar2 ^ 1U) ^ 1)))) {
          if (!bVar2) {
            prvTidyRemoveAnchorByNode(doc,av->value,node);
          }
          prvTidyRemoveAttribute(doc,node,av);
        }
      }
LAB_0014fda4:
      if (node->content != (Node *)0x0) {
        prvTidyFixAnchors(doc,node->content,wantName,wantId);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
            TY_(FixAnchors)(doc, node->content, wantName, wantId);

        node = next;
    }
}